

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_container_unit.c
# Opt level: O3

void array_bitset_ixor_test(void)

{
  ushort uVar1;
  _Bool _Var2;
  array_container_t *container;
  array_container_t *dst;
  array_container_t *dst_00;
  array_container_t *container_00;
  array_container_t *container_01;
  bitset_container_t *source;
  bitset_container_t *dest;
  bitset_container_t *dest_00;
  bitset_container_t *src_1;
  bitset_container_t *bitset;
  uint16_t *puVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ushort uVar8;
  int x;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  int32_t iVar14;
  bool bVar15;
  container_t *C;
  array_container_t *local_38;
  
  container = array_container_create();
  dst = array_container_create();
  dst_00 = array_container_create();
  container_00 = array_container_create();
  container_01 = array_container_create();
  source = bitset_container_create();
  dest = bitset_container_create();
  dest_00 = bitset_container_create();
  src_1 = bitset_container_create();
  bitset = bitset_container_create();
  iVar14 = container->cardinality;
  uVar10 = 0;
  do {
    uVar8 = (ushort)uVar10;
    if ((iVar14 == 0) ||
       ((puVar3 = container->array, iVar14 != 0x7fffffff && (puVar3[(long)iVar14 + -1] < uVar8)))) {
      if (iVar14 == container->capacity) {
        array_container_grow(container,iVar14 + 1,true);
        iVar14 = container->cardinality;
      }
      container->cardinality = iVar14 + 1;
      container->array[iVar14] = uVar8;
      iVar6 = iVar14 + 1;
    }
    else {
      if (iVar14 < 1) {
        uVar13 = 0;
      }
      else {
        iVar6 = iVar14 + -1;
        uVar13 = 0;
        do {
          uVar7 = iVar6 + (int)uVar13;
          uVar9 = uVar7 >> 1;
          uVar1 = *(ushort *)((long)puVar3 + (ulong)(uVar7 & 0xfffffffe));
          if (uVar1 < uVar8) {
            uVar13 = (ulong)(uVar9 + 1);
          }
          else {
            iVar6 = iVar14;
            if (uVar1 <= uVar8) goto LAB_00108231;
            iVar6 = uVar9 - 1;
          }
        } while ((int)uVar13 <= iVar6);
        iVar6 = 0x7fffffff;
        if (iVar14 == 0x7fffffff) goto LAB_00108231;
      }
      if (iVar14 == container->capacity) {
        array_container_grow(container,iVar14 + 1,true);
        puVar3 = container->array;
      }
      memmove(puVar3 + uVar13 + 1,puVar3 + uVar13,(long)(iVar14 - (int)uVar13) * 2);
      container->array[uVar13] = uVar8;
      iVar6 = container->cardinality + 1;
      container->cardinality = iVar6;
    }
LAB_00108231:
    iVar14 = iVar6;
    uVar9 = (uint)uVar10;
    uVar13 = source->words[uVar10 >> 6];
    uVar12 = uVar13 | 1L << (uVar10 & 0x3f);
    source->cardinality = source->cardinality + (int)((uVar13 ^ uVar12) >> ((byte)uVar10 & 0x3f));
    source->words[uVar10 >> 6] = uVar12;
    uVar10 = (ulong)(uVar9 + 3);
  } while (uVar9 < 0xfffd);
  iVar14 = container_00->cardinality;
  uVar9 = 0;
  do {
    uVar8 = (ushort)uVar9;
    if ((iVar14 == 0) ||
       ((puVar3 = container_00->array, iVar14 != 0x7fffffff && (puVar3[(long)iVar14 + -1] < uVar8)))
       ) {
      if (iVar14 == container_00->capacity) {
        array_container_grow(container_00,iVar14 + 1,true);
        iVar14 = container_00->cardinality;
      }
      container_00->cardinality = iVar14 + 1;
      container_00->array[iVar14] = uVar8;
      iVar6 = iVar14 + 1;
    }
    else {
      if (iVar14 < 1) {
        uVar10 = 0;
      }
      else {
        iVar6 = iVar14 + -1;
        uVar10 = 0;
        do {
          uVar11 = iVar6 + (int)uVar10;
          uVar7 = uVar11 >> 1;
          uVar1 = *(ushort *)((long)puVar3 + (ulong)(uVar11 & 0xfffffffe));
          if (uVar1 < uVar8) {
            uVar10 = (ulong)(uVar7 + 1);
          }
          else {
            iVar6 = iVar14;
            if (uVar1 <= uVar8) goto LAB_0010835c;
            iVar6 = uVar7 - 1;
          }
        } while ((int)uVar10 <= iVar6);
        iVar6 = 0x7fffffff;
        if (iVar14 == 0x7fffffff) goto LAB_0010835c;
      }
      if (iVar14 == container_00->capacity) {
        array_container_grow(container_00,iVar14 + 1,true);
        puVar3 = container_00->array;
      }
      memmove(puVar3 + uVar10 + 1,puVar3 + uVar10,(long)(iVar14 - (int)uVar10) * 2);
      container_00->array[uVar10] = uVar8;
      iVar6 = container_00->cardinality + 1;
      container_00->cardinality = iVar6;
    }
LAB_0010835c:
    iVar14 = iVar6;
    uVar10 = src_1->words[uVar9 >> 6];
    bVar4 = (byte)uVar9 & 0x3e;
    uVar13 = uVar10 | 1L << bVar4;
    src_1->cardinality = src_1->cardinality + (int)((uVar10 ^ uVar13) >> bVar4);
    src_1->words[uVar9 >> 6] = uVar13;
    bVar15 = uVar9 < 0xffc2;
    uVar9 = uVar9 + 0x3e;
  } while (bVar15);
  uVar9 = 0;
  do {
    if ((ushort)((ushort)(uVar9 * 0x7bdf) >> 1 | (ushort)((uVar9 * 0x7bdf & 1) != 0) << 0xf) < 0x422
        != (uVar9 * -0x5555 & 0xffff) < 0x5556) {
      iVar6 = container_01->cardinality;
      uVar8 = (ushort)uVar9;
      if (((long)iVar6 == 0) ||
         ((puVar3 = container_01->array, iVar6 != 0x7fffffff && (puVar3[(long)iVar6 + -1] < uVar8)))
         ) {
        if (iVar6 == container_01->capacity) {
          array_container_grow(container_01,iVar6 + 1,true);
          iVar6 = container_01->cardinality;
        }
        container_01->cardinality = iVar6 + 1;
        container_01->array[iVar6] = uVar8;
      }
      else {
        if (iVar6 < 1) {
          uVar10 = 0;
        }
        else {
          iVar5 = iVar6 + -1;
          uVar10 = 0;
          do {
            uVar11 = iVar5 + (int)uVar10;
            uVar7 = uVar11 >> 1;
            uVar1 = *(ushort *)((long)puVar3 + (ulong)(uVar11 & 0xfffffffe));
            if (uVar1 < uVar8) {
              uVar10 = (ulong)(uVar7 + 1);
            }
            else {
              if (uVar1 <= uVar8) goto LAB_001084a0;
              iVar5 = uVar7 - 1;
            }
          } while ((int)uVar10 <= iVar5);
          if (iVar6 == 0x7fffffff) goto LAB_001084a0;
        }
        if (iVar6 == container_01->capacity) {
          array_container_grow(container_01,iVar6 + 1,true);
          puVar3 = container_01->array;
        }
        memmove(puVar3 + uVar10 + 1,puVar3 + uVar10,(long)(iVar6 - (int)uVar10) * 2);
        container_01->array[uVar10] = uVar8;
        container_01->cardinality = container_01->cardinality + 1;
      }
LAB_001084a0:
      uVar10 = bitset->words[uVar9 >> 6];
      uVar13 = uVar10 | 1L << ((ulong)uVar9 & 0x3f);
      bitset->cardinality = bitset->cardinality + (int)((uVar10 ^ uVar13) >> ((byte)uVar9 & 0x3f));
      bitset->words[uVar9 >> 6] = uVar13;
    }
    uVar9 = uVar9 + 1;
  } while (uVar9 != 0x10000);
  array_container_copy(container,dst);
  bitset_container_copy(source,dest);
  array_container_copy(container,dst_00);
  iVar6 = dst_00->cardinality;
  if (((long)iVar6 == 0) ||
     ((puVar3 = dst_00->array, iVar6 != 0x7fffffff && (puVar3[(long)iVar6 + -1] < 2)))) {
    if (iVar6 == dst_00->capacity) {
      array_container_grow(dst_00,iVar6 + 1,true);
      iVar6 = dst_00->cardinality;
    }
    dst_00->cardinality = iVar6 + 1;
    dst_00->array[iVar6] = 2;
  }
  else {
    if (iVar6 < 1) {
      uVar9 = 0;
    }
    else {
      iVar5 = iVar6 + -1;
      uVar9 = 0;
      do {
        uVar7 = iVar5 + uVar9 >> 1;
        uVar8 = *(ushort *)((long)puVar3 + (ulong)(iVar5 + uVar9 & 0xfffffffe));
        if (uVar8 < 2) {
          uVar9 = uVar7 + 1;
        }
        else {
          if (uVar8 == 2) goto LAB_001085e0;
          iVar5 = uVar7 - 1;
        }
      } while ((int)uVar9 <= iVar5);
      if (iVar6 == 0x7fffffff) goto LAB_001085e0;
    }
    if (iVar6 == dst_00->capacity) {
      array_container_grow(dst_00,iVar6 + 1,true);
      puVar3 = dst_00->array;
    }
    memmove(puVar3 + (ulong)uVar9 + 1,puVar3 + uVar9,(long)(int)(iVar6 - uVar9) * 2);
    dst_00->array[uVar9] = 2;
    dst_00->cardinality = dst_00->cardinality + 1;
  }
LAB_001085e0:
  bitset_container_copy(source,dest_00);
  uVar10 = *dest_00->words;
  uVar13 = uVar10 | 4;
  dest_00->cardinality = dest_00->cardinality + (int)((uVar10 ^ uVar13) >> 2);
  *dest_00->words = uVar13;
  iVar6 = container_01->cardinality;
  local_38 = (array_container_t *)0x0;
  _Var2 = bitset_array_container_ixor(src_1,container,&local_38);
  _assert_true((ulong)_Var2,"bitset_array_container_ixor(B2, A1, &C)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x16d);
  _assert_int_equal((long)iVar6,(long)local_38->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x16e);
  _assert_int_equal((unsigned_long)local_38,(unsigned_long)src_1,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x170);
  local_38 = (array_container_t *)0x0;
  _Var2 = array_bitset_container_ixor(container_00,source,&local_38);
  _assert_true((ulong)_Var2,"array_bitset_container_ixor(A2, B1, &C)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x173);
  _assert_int_equal((long)iVar6,(long)local_38->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x174);
  _assert_int_not_equal
            ((unsigned_long)local_38,(unsigned_long)container_00,
             "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
             ,0x175);
  bitset_container_free((bitset_container_t *)local_38);
  local_38 = (array_container_t *)0x0;
  _Var2 = array_bitset_container_ixor(container,source,&local_38);
  _assert_true((ulong)!_Var2,"array_bitset_container_ixor(A1, B1, &C)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x17c);
  _assert_int_equal(0,(long)local_38->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x17d);
  array_container_free(local_38);
  local_38 = (array_container_t *)0x0;
  _Var2 = bitset_bitset_container_ixor(dest_00,dest,&local_38);
  _assert_true((ulong)!_Var2,"bitset_bitset_container_ixor(B1mod, B1copy, &C)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x183);
  _assert_int_equal(1,(long)local_38->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x184);
  array_container_free(local_38);
  local_38 = (array_container_t *)0x0;
  _Var2 = array_array_container_ixor(dst_00,dst,&local_38);
  _assert_true((ulong)!_Var2,"array_array_container_ixor(A1mod, A1copy, &C)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x188);
  _assert_int_equal(1,(long)local_38->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x189);
  array_container_free(container_01);
  array_container_free(dst);
  bitset_container_free(source);
  bitset_container_free(dest);
  bitset_container_free(src_1);
  bitset_container_free(bitset);
  array_container_free(local_38);
  return;
}

Assistant:

DEFINE_TEST(array_bitset_ixor_test) {
    array_container_t* A1 = array_container_create();
    array_container_t* A1copy = array_container_create();
    array_container_t* A1mod = array_container_create();
    array_container_t* A2 = array_container_create();
    array_container_t* AX = array_container_create();
    bitset_container_t* B1 = bitset_container_create();
    bitset_container_t* B1copy = bitset_container_create();
    bitset_container_t* B1mod = bitset_container_create();
    bitset_container_t* B2 = bitset_container_create();
    bitset_container_t* BX = bitset_container_create();

    // nb, array containers will be illegally big.
    for (int x = 0; x < (1 << 16); x += 3) {
        array_container_add(A1, x);
        bitset_container_set(B1, x);
    }

    // important: 62 is not divisible by 3
    for (int x = 0; x < (1 << 16); x += 62) {
        array_container_add(A2, x);
        bitset_container_set(B2, x);
    }

    for (int x = 0; x < (1 << 16); x++)
        if ((x % 62 == 0) ^ (x % 3 == 0)) {
            array_container_add(AX, x);
            bitset_container_set(BX, x);
        }

    array_container_copy(A1, A1copy);
    bitset_container_copy(B1, B1copy);
    array_container_copy(A1, A1mod);
    array_container_add(A1mod, 2);
    bitset_container_copy(B1, B1mod);
    bitset_container_add(B1mod, 2);

    int cx = array_container_cardinality(AX);  // expected xor

    container_t* C = NULL;

    assert_true(bitset_array_container_ixor(B2, A1, &C));
    assert_int_equal(cx, bitset_container_cardinality(CAST_bitset(C)));
    // this case, result is inplace
    assert_ptr_equal(C, B2);

    C = NULL;
    assert_true(array_bitset_container_ixor(A2, B1, &C));
    assert_int_equal(cx, bitset_container_cardinality(CAST_bitset(C)));
    assert_ptr_not_equal(C, A2);  // nb A2 is destroyed
    // don't test a case where result can fit in the array
    // until this is implemented...at that point, make sure

    bitset_container_free(CAST_bitset(C));
    C = NULL;
    // xoring something with itself, getting array
    assert_false(array_bitset_container_ixor(A1, B1, &C));
    assert_int_equal(0, array_container_cardinality(CAST_array(C)));

    array_container_free(CAST_array(C));
    C = NULL;

    // B1mod and B1copy differ in position 2 only
    assert_false(bitset_bitset_container_ixor(B1mod, B1copy, &C));
    assert_int_equal(1, array_container_cardinality(CAST_array(C)));

    array_container_free(CAST_array(C));
    C = NULL;
    assert_false(array_array_container_ixor(A1mod, A1copy, &C));
    assert_int_equal(1, array_container_cardinality(CAST_array(C)));

    // array_container_free(A1); // disposed already
    //    array_container_free(A2); // has been disposed already
    array_container_free(AX);
    array_container_free(A1copy);

    bitset_container_free(B1);
    bitset_container_free(B1copy);
    bitset_container_free(B2);
    bitset_container_free(BX);
    array_container_free(CAST_array(C));
}